

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int queue_5_3::deQueue(sq_queue *q,int *e)

{
  int iVar1;
  bool bVar2;
  allocator local_31;
  string local_30;
  
  iVar1 = q->front;
  bVar2 = iVar1 != q->rear;
  if (bVar2) {
    *e = q->data[iVar1];
    q->front = (q->front + 1) % q->ssize;
  }
  else {
    std::__cxx11::string::string((string *)&local_30,anon_var_dwarf_1b69,&local_31);
    errCode(&local_30,0);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return (uint)bVar2;
}

Assistant:

int deQueue(sq_queue &q, int &e) {
        if (q.front == q.rear)
            return errCode("空队", 0);

        e = q.data[q.front];
        q.front = (q.front + 1) % q.ssize;
        return 1;
    }